

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result_conflict * __thiscall
CoreML::NeuralNetworkSpecValidator::validateConstantPadLayer
          (Result_conflict *__return_storage_ptr__,NeuralNetworkSpecValidator *this,
          NeuralNetworkLayer *layer)

{
  undefined8 layer_00;
  bool bVar1;
  int iVar2;
  string *psVar3;
  uint64 uVar4;
  undefined1 local_298 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  string local_218;
  int local_1f0;
  int pad_b;
  int pad_a;
  int i;
  undefined1 local_1c8 [8];
  string err_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string local_128;
  ConstantPaddingLayerParams *pCStack_100;
  int len;
  ConstantPaddingLayerParams *params;
  undefined1 local_f0 [32];
  undefined1 local_d0 [40];
  Result local_a8;
  undefined1 local_70 [48];
  Result_conflict r;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  
  r._32_8_ = layer;
  Result::Result((Result *)(local_70 + 0x28));
  validateInputCount((Result_conflict *)local_70,(NeuralNetworkLayer *)r._32_8_,1,2);
  Result::operator=((Result *)(local_70 + 0x28),(Result *)local_70);
  Result::~Result((Result *)local_70);
  bVar1 = Result::good((Result *)(local_70 + 0x28));
  if (bVar1) {
    validateOutputCount((Result_conflict *)(local_d0 + 0x28),(NeuralNetworkLayer *)r._32_8_,1,1);
    Result::operator=((Result *)(local_70 + 0x28),(Result *)(local_d0 + 0x28));
    Result::~Result((Result *)(local_d0 + 0x28));
    bVar1 = Result::good((Result *)(local_70 + 0x28));
    layer_00 = r._32_8_;
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_f0,"ConstantPad",(allocator *)((long)&params + 7));
      validateInputOutputRankEquality
                ((Result_conflict *)local_d0,(NeuralNetworkLayer *)layer_00,(string *)local_f0,
                 &this->blobNameToRank);
      Result::operator=((Result *)(local_70 + 0x28),(Result *)local_d0);
      Result::~Result((Result *)local_d0);
      std::__cxx11::string::~string((string *)local_f0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&params + 7));
      bVar1 = Result::good((Result *)(local_70 + 0x28));
      if (bVar1) {
        pCStack_100 = Specification::NeuralNetworkLayer::constantpad((NeuralNetworkLayer *)r._32_8_)
        ;
        iVar2 = Specification::NeuralNetworkLayer::input_size((NeuralNetworkLayer *)r._32_8_);
        if (iVar2 == 1) {
          local_128._M_storage._M_storage._4_4_ =
               Specification::ConstantPaddingLayerParams::padamounts_size(pCStack_100);
          if ((int)local_128._M_storage._M_storage._4_4_ % 2 != 0) {
            psVar3 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                               ((NeuralNetworkLayer *)r._32_8_);
            std::operator+(&local_188,"In \'ConstantPad\' layer \'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           psVar3);
            std::operator+(&local_168,&local_188,"\', length of \'padAmounts\' parameter is ");
            std::__cxx11::to_string
                      ((string *)&err_1.super__Rb_tree_node_base._M_right,
                       local_128._M_storage._M_storage._4_4_);
            std::operator+(&local_148,&local_168,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &err_1.super__Rb_tree_node_base._M_right);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_128,&local_148,", an odd value, which is not allowed.");
            std::__cxx11::string::~string((string *)&local_148);
            std::__cxx11::string::~string((string *)&err_1.super__Rb_tree_node_base._M_right);
            std::__cxx11::string::~string((string *)&local_168);
            std::__cxx11::string::~string((string *)&local_188);
            Result::Result((Result *)__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_128);
            local_a8.m_message._M_storage._M_storage[0] = '\x01';
            local_a8.m_message._M_storage._M_storage[1] = '\0';
            local_a8.m_message._M_storage._M_storage[2] = '\0';
            local_a8.m_message._M_storage._M_storage[3] = '\0';
            std::__cxx11::string::~string((string *)&local_128);
            goto LAB_004202d8;
          }
          if (local_128._M_storage._M_storage._4_4_ == 0) {
            psVar3 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                               ((NeuralNetworkLayer *)r._32_8_);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &pad_a,"In \'ConstantPad\' layer \'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           psVar3);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1c8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &pad_a,
                           "\', length of \'padAmounts\' cannot be zero when only 1 input is provided."
                          );
            std::__cxx11::string::~string((string *)&pad_a);
            Result::Result((Result *)__return_storage_ptr__,INVALID_MODEL_PARAMETERS,
                           (string *)local_1c8);
            local_a8.m_message._M_storage._M_storage[0] = '\x01';
            local_a8.m_message._M_storage._M_storage[1] = '\0';
            local_a8.m_message._M_storage._M_storage[2] = '\0';
            local_a8.m_message._M_storage._M_storage[3] = '\0';
            std::__cxx11::string::~string((string *)local_1c8);
            goto LAB_004202d8;
          }
          bVar1 = Specification::ConstantPaddingLayerParams::padtogivenoutputsizemode(pCStack_100);
          if (bVar1) {
            for (pad_b = 0; pad_b < (int)local_128._M_storage._M_storage._4_4_ / 2;
                pad_b = pad_b + 1) {
              uVar4 = Specification::ConstantPaddingLayerParams::padamounts(pCStack_100,pad_b * 2);
              local_1f0 = (int)uVar4;
              uVar4 = Specification::ConstantPaddingLayerParams::padamounts
                                (pCStack_100,pad_b * 2 + 1);
              local_218._M_storage._M_storage._4_4_ = SUB84(uVar4,0);
              if ((0 < local_1f0) && (0 < (int)local_218._M_storage._M_storage._4_4_)) {
                psVar3 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                   ((NeuralNetworkLayer *)r._32_8_);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (local_298 + 0x20),"In \'ConstantPad\' layer \'",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               psVar3);
                std::operator+(&local_258,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (local_298 + 0x20),
                               "\', \'padToGivenOutputSizeMode\' is true, and both padding values corresponding to dimension "
                              );
                std::__cxx11::to_string((string *)local_298,pad_b);
                std::operator+(&local_238,&local_258,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_298);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_218,&local_238,
                               " are non zero, which is invalid. Only one value can be non-zero.");
                std::__cxx11::string::~string((string *)&local_238);
                std::__cxx11::string::~string((string *)local_298);
                std::__cxx11::string::~string((string *)&local_258);
                std::__cxx11::string::~string((string *)(local_298 + 0x20));
                Result::Result((Result *)__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_218)
                ;
                local_a8.m_message._M_storage._M_storage[0] = '\x01';
                local_a8.m_message._M_storage._M_storage[1] = '\0';
                local_a8.m_message._M_storage._M_storage[2] = '\0';
                local_a8.m_message._M_storage._M_storage[3] = '\0';
                std::__cxx11::string::~string((string *)&local_218);
                goto LAB_004202d8;
              }
            }
          }
        }
        Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
        local_a8.m_message._M_storage._M_storage[0] = '\x01';
        local_a8.m_message._M_storage._M_storage[1] = '\0';
        local_a8.m_message._M_storage._M_storage[2] = '\0';
        local_a8.m_message._M_storage._M_storage[3] = '\0';
      }
      else {
        Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
        local_a8.m_message._M_storage._M_storage[0] = '\x01';
        local_a8.m_message._M_storage._M_storage[1] = '\0';
        local_a8.m_message._M_storage._M_storage[2] = '\0';
        local_a8.m_message._M_storage._M_storage[3] = '\0';
      }
    }
    else {
      Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
      local_a8.m_message._M_storage._M_storage[0] = '\x01';
      local_a8.m_message._M_storage._M_storage[1] = '\0';
      local_a8.m_message._M_storage._M_storage[2] = '\0';
      local_a8.m_message._M_storage._M_storage[3] = '\0';
    }
  }
  else {
    Result::Result((Result *)__return_storage_ptr__,(Result *)(local_70 + 0x28));
    local_a8.m_message._M_storage._M_storage[0] = '\x01';
    local_a8.m_message._M_storage._M_storage[1] = '\0';
    local_a8.m_message._M_storage._M_storage[2] = '\0';
    local_a8.m_message._M_storage._M_storage[3] = '\0';
  }
LAB_004202d8:
  Result::~Result((Result *)(local_70 + 0x28));
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateConstantPadLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 2);
    if (!r.good()) {return r;}
    r = validateOutputCount(layer, 1, 1);
    if (!r.good()) {return r;}
    r = validateInputOutputRankEquality(layer, "ConstantPad", blobNameToRank);
    if (!r.good()) {return r;}

    const auto& params = layer.constantpad();

    if (layer.input_size() == 1) {
        int len = params.padamounts_size();
        if (len % 2 != 0) {
            const std::string err = "In 'ConstantPad' layer '" + layer.name() + "', length of 'padAmounts' parameter is " + std::to_string(len) + ", an odd value, which is not allowed.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
        if (len == 0) {
            const std::string err = "In 'ConstantPad' layer '" + layer.name() + "', length of 'padAmounts' cannot be zero when only 1 input is provided.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
        if (params.padtogivenoutputsizemode()) {
            for (int i=0; i < len/2; i++) {
                int pad_a = (int)params.padamounts(2*i);
                int pad_b = (int)params.padamounts(2*i+1);
                if (pad_a > 0 && pad_b > 0) {
                    const std::string err = "In 'ConstantPad' layer '" + layer.name() + "', 'padToGivenOutputSizeMode' is true, and both padding values corresponding to dimension " + std::to_string(i) + " are non zero, which is invalid. Only one value can be non-zero.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
            }
        }
    }

    return r;
}